

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeQuaternionEKF.cpp
# Opt level: O2

void __thiscall iDynTree::AttitudeQuaternionEKF::deserializeStateVector(AttitudeQuaternionEKF *this)

{
  Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> b;
  Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> Omega;
  Map<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_> q;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> x;
  Vector3 *local_b0 [2];
  Vector3 *local_a0 [2];
  AttitudeEstimatorState *local_90 [2];
  undefined1 local_80 [24];
  Index IStack_68;
  undefined1 local_60;
  variable_if_dynamic<long,__1> local_58;
  Index local_48;
  PointerType local_40;
  Index IStack_38;
  undefined1 local_30;
  
  toEigen((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_40,
          &this->m_x);
  local_90[0] = &this->m_state_qekf;
  local_a0[0] = &(this->m_state_qekf).m_angular_velocity;
  local_b0[0] = &(this->m_state_qekf).m_gyroscope_bias;
  local_80._0_8_ = local_40;
  local_80._16_8_ = local_40;
  IStack_68 = IStack_38;
  local_60 = local_30;
  local_58.m_value = 0;
  local_48 = IStack_38;
  Eigen::internal::
  call_assignment<Eigen::Map<Eigen::Matrix<double,4,1,0,4,1>,0,Eigen::Stride<0,0>>,Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,4,1,false>>
            ((Map<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_> *)local_90,
             (Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_4,_1,_false>
              *)local_80);
  local_80._0_8_ = local_40 + 4;
  local_80._16_8_ = local_40;
  IStack_68 = IStack_38;
  local_60 = local_30;
  local_58.m_value = 4;
  local_48 = IStack_38;
  Eigen::internal::
  call_assignment<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>,Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,3,1,false>>
            ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_a0,
             (Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false>
              *)local_80);
  local_80._0_8_ = local_40 + 7;
  local_80._16_8_ = local_40;
  IStack_68 = IStack_38;
  local_60 = local_30;
  local_58.m_value = 7;
  local_48 = IStack_38;
  Eigen::internal::
  call_assignment<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>,Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,3,1,false>>
            ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_b0,
             (Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false>
              *)local_80);
  return;
}

Assistant:

void iDynTree::AttitudeQuaternionEKF::deserializeStateVector()
{
    using iDynTree::toEigen;
    auto x(toEigen(m_x));
    auto q(toEigen(m_state_qekf.m_orientation));
    auto Omega(toEigen(m_state_qekf.m_angular_velocity));
    auto b(toEigen(m_state_qekf.m_gyroscope_bias));

    q = x.block<4, 1>(0, 0);
    Omega = x.block<3, 1>(4, 0);
    b = x.block<3, 1>(7, 0);
}